

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O3

void ncnn::convdw3x3s2_int8_dequant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_dequant,Option *opt)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  pointer pfVar17;
  size_t sVar18;
  size_t sVar19;
  void *pvVar20;
  undefined1 auVar21 [16];
  uint uVar22;
  long lVar23;
  int iVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  uint uVar27;
  char *pcVar28;
  ulong uVar29;
  char *pcVar30;
  long lVar31;
  char *pcVar32;
  long lVar33;
  void *pvVar34;
  float *pfVar35;
  int iVar36;
  undefined1 in_ZMM3 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  auVar26 = _DAT_00314280;
  auVar25 = _DAT_00314260;
  iVar11 = top_blob->c;
  if (0 < (long)iVar11) {
    iVar12 = top_blob->w;
    iVar13 = top_blob->h;
    iVar14 = bottom_blob->w;
    iVar24 = (iVar14 - iVar12) * 2;
    iVar15 = top_blob->dims;
    pvVar16 = top_blob->data;
    lVar33 = top_blob->cstep * top_blob->elemsize;
    pfVar17 = (scales_dequant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    sVar18 = bottom_blob->cstep;
    sVar19 = bottom_blob->elemsize;
    pvVar20 = bottom_blob->data;
    lVar31 = 0;
    auVar21 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    pvVar34 = pvVar16;
    do {
      iVar36 = 1;
      if (iVar15 != 3) {
        iVar36 = top_blob->d;
      }
      if (_bias == (Mat *)0x0) {
        auVar37 = ZEXT816(0) << 0x40;
      }
      else {
        auVar37 = ZEXT416(*(uint *)((long)&_bias->data + lVar31 * 4));
      }
      fVar7 = pfVar17[lVar31];
      uVar27 = iVar36 * iVar13 * iVar12;
      if (0 < (int)uVar27) {
        auVar39._8_8_ = 0;
        auVar39._0_8_ = (ulong)uVar27 - 1;
        auVar39 = vpshufd_avx(auVar39,0x44);
        auVar37 = vshufps_avx(auVar37,auVar37,0);
        auVar38._16_16_ = auVar37;
        auVar38._0_16_ = auVar37;
        uVar29 = auVar39._0_8_;
        auVar37._0_8_ = uVar29 ^ 0x8000000000000000;
        auVar37._8_4_ = auVar39._8_4_;
        uVar22 = auVar39._12_4_;
        auVar37._12_4_ = uVar22 ^ 0x80000000;
        auVar40._0_8_ = uVar29 ^ 0x8000000000000000;
        auVar40._8_4_ = auVar37._8_4_;
        auVar40._12_4_ = uVar22 ^ 0x80000000;
        auVar41._0_8_ = uVar29 ^ 0x8000000000000000;
        auVar41._8_4_ = auVar37._8_4_;
        auVar41._12_4_ = uVar22 ^ 0x80000000;
        uVar29 = 0;
        do {
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar29;
          auVar39 = vpshufd_avx(auVar42,0x44);
          auVar44._16_16_ = auVar39;
          auVar44._0_16_ = auVar39;
          auVar45 = vorps_avx(auVar44,auVar25);
          auVar44 = vorps_avx(auVar44,auVar26);
          auVar47._0_8_ = auVar44._16_8_ ^ 0x8000000000000000;
          auVar47._8_4_ = auVar44._24_4_;
          auVar47._12_4_ = auVar44._28_4_ ^ 0x80000000;
          auVar39 = vpcmpgtq_avx(auVar47,auVar37);
          auVar43._0_8_ = auVar44._0_8_ ^ 0x8000000000000000;
          auVar43._8_4_ = auVar44._8_4_;
          auVar43._12_4_ = auVar44._12_4_ ^ 0x80000000;
          auVar42 = vpcmpgtq_avx(auVar43,auVar40);
          auVar39 = vpackssdw_avx(auVar42,auVar39);
          auVar48._0_8_ = auVar45._16_8_ ^ 0x8000000000000000;
          auVar48._8_4_ = auVar45._24_4_;
          auVar48._12_4_ = auVar45._28_4_ ^ 0x80000000;
          auVar42 = vpcmpgtq_avx(auVar48,auVar37);
          auVar46._0_8_ = auVar45._0_8_ ^ 0x8000000000000000;
          auVar46._8_4_ = auVar45._8_4_;
          auVar46._12_4_ = auVar45._12_4_ ^ 0x80000000;
          auVar43 = vpcmpgtq_avx(auVar46,auVar41);
          auVar42 = vpackssdw_avx(auVar43,auVar42);
          auVar39 = vpackssdw_avx(auVar42 ^ auVar21,auVar39 ^ auVar21);
          auVar42 = vpmovsxwd_avx(auVar39);
          auVar39 = vpunpckhwd_avx(auVar39,auVar39);
          auVar45._16_16_ = auVar39;
          auVar45._0_16_ = auVar42;
          auVar45 = vmaskmovps_avx(auVar45,auVar38);
          *(undefined1 (*) [32])((long)pvVar34 + uVar29 * 4) = auVar45;
          uVar29 = uVar29 + 8;
        } while ((uVar27 + 7 & 0xfffffff8) != uVar29);
      }
      if (0 < iVar13) {
        pfVar35 = (float *)(lVar33 * lVar31 + (long)pvVar16);
        lVar23 = lVar31 * 9;
        pcVar30 = (char *)(sVar18 * sVar19 * lVar31 + (long)pvVar20);
        pcVar28 = pcVar30 + (long)iVar14 * 2;
        pcVar32 = pcVar30 + iVar14;
        iVar36 = 0;
        do {
          uVar27 = iVar12 + 1;
          if (0 < iVar12) {
            do {
              cVar8 = *pcVar30;
              pcVar1 = pcVar30 + 1;
              pcVar2 = pcVar30 + 2;
              pcVar30 = pcVar30 + 2;
              cVar9 = *pcVar32;
              pcVar3 = pcVar32 + 1;
              pcVar4 = pcVar32 + 2;
              pcVar32 = pcVar32 + 2;
              cVar10 = *pcVar28;
              pcVar5 = pcVar28 + 1;
              pcVar6 = pcVar28 + 2;
              pcVar28 = pcVar28 + 2;
              *pfVar35 = fVar7 * (float)((int)*(char *)((long)&_kernel->refcount + lVar23) *
                                         (int)*pcVar6 +
                                         (int)*(char *)((long)&_kernel->data + lVar23 + 7) *
                                         (int)*pcVar5 +
                                        (int)*(char *)((long)&_kernel->data + lVar23 + 6) *
                                        (int)cVar10 +
                                        (int)*(char *)((long)&_kernel->data + lVar23 + 5) *
                                        (int)*pcVar4 +
                                        (int)*(char *)((long)&_kernel->data + lVar23 + 4) *
                                        (int)*pcVar3 +
                                        (int)*(char *)((long)&_kernel->data + lVar23 + 3) *
                                        (int)cVar9 +
                                        (int)*(char *)((long)&_kernel->data + lVar23 + 2) *
                                        (int)*pcVar2 +
                                        (int)*(char *)((long)&_kernel->data + lVar23 + 1) *
                                        (int)*pcVar1 +
                                        (int)*(char *)((long)&_kernel->data + lVar23) * (int)cVar8)
                         + *pfVar35;
              pfVar35 = pfVar35 + 1;
              uVar27 = uVar27 - 1;
            } while (1 < uVar27);
          }
          pcVar30 = pcVar30 + iVar24;
          pcVar32 = pcVar32 + iVar24;
          pcVar28 = pcVar28 + iVar24;
          iVar36 = iVar36 + 1;
        } while (iVar36 != iVar13);
      }
      lVar31 = lVar31 + 1;
      pvVar34 = (void *)((long)pvVar34 + lVar33);
    } while (lVar31 != iVar11);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_dequant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_dequant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        float* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_dequant = scales_dequant[p];

        out.fill(bias0);

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr += (float)sum * scale_dequant;

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}